

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamReaderPrivate::Rewind(BamReaderPrivate *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int64_t *in_stack_00000070;
  string message;
  string currentError;
  BamRandomAccessController *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  allocator local_a9;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70 [16];
  undefined8 in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  BamReaderPrivate *in_stack_ffffffffffffffb0;
  string local_30 [47];
  byte local_1;
  
  BamRandomAccessController::ClearRegion(in_stack_ffffffffffffff40);
  bVar1 = Seek((BamReaderPrivate *)message._0_8_,in_stack_00000070);
  if (bVar1) {
    local_1 = 1;
  }
  else {
    std::__cxx11::string::string(local_30,(string *)&in_RDI[0x11]._M_string_length);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"could not rewind: \n\t",(allocator *)__rhs);
    std::operator+(in_RDI,__rhs);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"BamReader::Rewind",&local_a9);
    SetErrorString(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   (string *)in_stack_ffffffffffffffa0);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    local_1 = 0;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string(local_30);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamReaderPrivate::Rewind(void) {

    // reset region
    m_randomAccessController.ClearRegion();

    // return status of seeking back to first alignment
    if ( Seek(m_alignmentsBeginOffset) )
        return true;
    else {
        const string currentError = m_errorString;
        const string message = string("could not rewind: \n\t") + currentError;
        SetErrorString("BamReader::Rewind", message);
        return false;
    }
}